

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.h
# Opt level: O3

uchar * append_uint32(uchar *cp,uint32_t i)

{
  uchar *puVar1;
  byte bVar2;
  uint uVar3;
  char cVar4;
  ulong uVar5;
  
  if (i == 0) {
    *cp = '0';
LAB_00146da2:
    return cp + 1;
  }
  if (i < 100) {
    if (i < 10) {
      *cp = (byte)i | 0x30;
      goto LAB_00146da2;
    }
    bVar2 = (byte)((i & 0xff) / 10);
    *cp = bVar2 | 0x30;
    cVar4 = (byte)i + bVar2 * -10;
    goto LAB_00146fea;
  }
  if (i < 10000) {
    if (999 < i) {
      uVar3 = (i & 0xffff) / 1000;
      *cp = (char)uVar3 + '0';
      uVar3 = uVar3 * -1000 + i;
      goto LAB_00146fb2;
    }
    uVar3 = (i & 0xffff) / 100;
    *cp = (byte)uVar3 | 0x30;
    cp = cp + 1;
    uVar3 = uVar3 * -100 + i;
  }
  else {
    if (i < 1000000) {
      if (99999 < i) {
        *cp = (byte)((ulong)(i >> 5) / 0xc35) | 0x30;
        uVar3 = ((i >> 5) / 0xc35) * -100000 + i;
        goto LAB_00146f76;
      }
      *cp = (byte)(i / 10000) | 0x30;
      cp = cp + 1;
      uVar3 = i % 10000;
    }
    else {
      if (i < 100000000) {
        if (9999999 < i) {
          *cp = (byte)(i / 10000000) | 0x30;
          uVar3 = i % 10000000;
          puVar1 = cp;
          goto LAB_00146f38;
        }
        *cp = (char)(i / 1000000) + '0';
        cp = cp + 1;
        uVar3 = i % 1000000;
      }
      else {
        if (i < 1000000000) {
          puVar1 = cp + 1;
          bVar2 = (byte)((ulong)i / 100000000);
          uVar3 = i % 100000000;
        }
        else {
          uVar5 = (ulong)(i >> 9) * 0x44b83;
          bVar2 = (byte)(uVar5 >> 0x27);
          uVar3 = (uint)(uVar5 >> 0x27) * -1000000000 + i;
          puVar1 = cp + 2;
          cp[1] = (char)(uVar3 / 100000000) + '0';
          uVar3 = uVar3 % 100000000;
        }
        *cp = bVar2 | 0x30;
        *puVar1 = (char)(uVar3 / 10000000) + '0';
        uVar3 = uVar3 % 10000000;
LAB_00146f38:
        puVar1[1] = (char)(uVar3 / 1000000) + '0';
        cp = puVar1 + 2;
        uVar3 = uVar3 % 1000000;
      }
      *cp = (char)((uVar3 >> 5) / 0xc35) + '0';
      uVar3 = uVar3 + ((uVar3 >> 5) / 0xc35) * -100000;
LAB_00146f76:
      cp[1] = (char)(uVar3 / 10000) + '0';
      cp = cp + 2;
      uVar3 = uVar3 % 10000;
    }
    *cp = (char)(uVar3 / 1000) + '0';
    uVar3 = uVar3 % 1000;
LAB_00146fb2:
    cp[1] = (char)(uVar3 / 100) + '0';
    cp = cp + 2;
    uVar3 = uVar3 % 100;
  }
  *cp = (char)(uVar3 / 10) + '0';
  cVar4 = (char)uVar3 + (char)(uVar3 / 10) * -10;
LAB_00146fea:
  cp[1] = cVar4 + '0';
  return cp + 2;
}

Assistant:

static inline unsigned char *append_uint32(unsigned char *cp, uint32_t i) {
    uint32_t j;

    if (i == 0) {
	*cp++ = '0';
	return cp;
    }

    if (i < 100)        goto b1;
    if (i < 10000)      goto b3;
    if (i < 1000000)    goto b5;
    if (i < 100000000)  goto b7;

    if ((j = i / 1000000000)) {*cp++ = j + '0'; i -= j*1000000000; goto x8;}
    if ((j = i / 100000000))  {*cp++ = j + '0'; i -= j*100000000;  goto x7;}
 b7:if ((j = i / 10000000))   {*cp++ = j + '0'; i -= j*10000000;   goto x6;}
    if ((j = i / 1000000))    {*cp++ = j + '0', i -= j*1000000;    goto x5;}
 b5:if ((j = i / 100000))     {*cp++ = j + '0', i -= j*100000;     goto x4;}
    if ((j = i / 10000))      {*cp++ = j + '0', i -= j*10000;      goto x3;}
 b3:if ((j = i / 1000))       {*cp++ = j + '0', i -= j*1000;       goto x2;}
    if ((j = i / 100))        {*cp++ = j + '0', i -= j*100;        goto x1;}
 b1:if ((j = i / 10))         {*cp++ = j + '0', i -= j*10;         goto x0;}
    if (i)                     *cp++ = i + '0';
    return cp;

 x8: *cp++ = i / 100000000 + '0', i %= 100000000;
 x7: *cp++ = i / 10000000  + '0', i %= 10000000;
 x6: *cp++ = i / 1000000   + '0', i %= 1000000;
 x5: *cp++ = i / 100000    + '0', i %= 100000;
 x4: *cp++ = i / 10000     + '0', i %= 10000;
 x3: *cp++ = i / 1000      + '0', i %= 1000;
 x2: *cp++ = i / 100       + '0', i %= 100;
 x1: *cp++ = i / 10        + '0', i %= 10;
 x0: *cp++ = i             + '0';

    return cp;
}